

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O1

int json_encode(lua_State *l)

{
  int iVar1;
  json_config_t *cfg;
  strbuf_t *json;
  strbuf_t local_encode_buf;
  strbuf_t sStack_38;
  
  json = &sStack_38;
  cfg = json_fetch_config(l);
  iVar1 = lua_gettop(l);
  if (iVar1 != 1) {
    luaL_argerror(l,1,"expected 1 argument");
  }
  if (cfg->encode_keep_buffer == 0) {
    strbuf_init(&sStack_38,0);
  }
  else {
    json = &cfg->encode_buf;
    (cfg->encode_buf).length = 0;
  }
  json_append_data(l,cfg,0,json);
  lua_pushlstring(l,json->buf,(long)json->length);
  if (cfg->encode_keep_buffer == 0) {
    strbuf_free(json);
  }
  return 1;
}

Assistant:

static int json_encode(lua_State *l)
{
    json_config_t *cfg = json_fetch_config(l);
    strbuf_t local_encode_buf;
    strbuf_t *encode_buf;
    char *json;
    int len;

    luaL_argcheck(l, lua_gettop(l) == 1, 1, "expected 1 argument");

    if (!cfg->encode_keep_buffer) {
        /* Use private buffer */
        encode_buf = &local_encode_buf;
        strbuf_init(encode_buf, 0);
    } else {
        /* Reuse existing buffer */
        encode_buf = &cfg->encode_buf;
        strbuf_reset(encode_buf);
    }

    json_append_data(l, cfg, 0, encode_buf);
    json = strbuf_string(encode_buf, &len);

    lua_pushlstring(l, json, len);

    if (!cfg->encode_keep_buffer)
        strbuf_free(encode_buf);

    return 1;
}